

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::DebugNodeDockNode(ImGuiDockNode *node,char *label)

{
  bool bVar1;
  bool bVar2;
  ImGuiWindow *pIVar3;
  ImDrawList *this;
  char *pcVar4;
  void *ptr_id;
  char *pcVar5;
  char *pcVar6;
  char *pcVar7;
  char *pcVar8;
  char *pcVar9;
  int iVar10;
  int iVar11;
  ImVec2 local_38;
  
  iVar10 = GImGui->FrameCount - node->LastFrameAlive;
  iVar11 = GImGui->FrameCount - node->LastFrameActive;
  if (1 < iVar10) {
    PushStyleColor(0,(GImGui->Style).Colors + 1);
  }
  ptr_id = (void *)(ulong)node->ID;
  pcVar7 = " (hidden)";
  if ((node->field_0xbd & 2) != 0) {
    pcVar7 = "";
  }
  if ((node->Windows).Size < 1) {
    pcVar6 = "n/a";
    if (node->SplitAxis == ImGuiAxis_Y) {
      pcVar6 = "vertical";
    }
    pcVar5 = "horizontal";
    if (node->SplitAxis != ImGuiAxis_X) {
      pcVar5 = pcVar6;
    }
    if (node->VisibleWindow == (ImGuiWindow *)0x0) {
      pcVar6 = "NULL";
    }
    else {
      pcVar6 = node->VisibleWindow->Name;
    }
    bVar1 = TreeNode(ptr_id,"%s 0x%04X%s: %s split (vis: \'%s\')",label,ptr_id,pcVar7,pcVar5,pcVar6)
    ;
  }
  else {
    bVar1 = TreeNode(ptr_id,"%s 0x%04X%s: %d windows (vis: \'%s\')",label);
  }
  if (1 < iVar10) {
    PopStyleColor(1);
  }
  if (((iVar11 < 2) && (bVar2 = IsItemHovered(0), bVar2)) &&
     ((pIVar3 = node->HostWindow, pIVar3 != (ImGuiWindow *)0x0 ||
      (pIVar3 = node->VisibleWindow, pIVar3 != (ImGuiWindow *)0x0)))) {
    this = GetViewportDrawList(pIVar3->Viewport,1,"##Foreground");
    local_38.x = (node->Size).x + (node->Pos).x;
    local_38.y = (node->Size).y + (node->Pos).y;
    ImDrawList::AddRect(this,&node->Pos,&local_38,0xff00ffff,0.0,0,1.0);
  }
  if (bVar1 != false) {
    if ((node->ChildNodes[0] != (ImGuiDockNode *)0x0) && (node->ChildNodes[0]->ParentNode != node))
    {
      __assert_fail("node->ChildNodes[0] == __null || node->ChildNodes[0]->ParentNode == node",
                    "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui.cpp"
                    ,0x4310,"void ImGui::DebugNodeDockNode(ImGuiDockNode *, const char *)");
    }
    if ((node->ChildNodes[1] != (ImGuiDockNode *)0x0) && (node->ChildNodes[1]->ParentNode != node))
    {
      __assert_fail("node->ChildNodes[1] == __null || node->ChildNodes[1]->ParentNode == node",
                    "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui.cpp"
                    ,0x4311,"void ImGui::DebugNodeDockNode(ImGuiDockNode *, const char *)");
    }
    BulletText("Pos (%.0f,%.0f), Size (%.0f, %.0f) Ref (%.0f, %.0f)",(double)(node->Pos).x,
               (double)(node->Pos).y,(double)(node->Size).x,(double)(node->Size).y,
               (double)(node->SizeRef).x,(double)(node->SizeRef).y);
    DebugNodeWindow(node->HostWindow,"HostWindow");
    DebugNodeWindow(node->VisibleWindow,"VisibleWindow");
    BulletText("SelectedTabID: 0x%08X, LastFocusedNodeID: 0x%08X",(ulong)node->SelectedTabId,
               (ulong)node->LastFocusedNodeId);
    pcVar7 = " IsDockSpace";
    if (((uint)node->MergedFlags >> 10 & 1) == 0) {
      pcVar7 = "";
    }
    pcVar6 = " IsCentralNode";
    if (((uint)node->MergedFlags >> 0xb & 1) == 0) {
      pcVar6 = "";
    }
    pcVar5 = " IsAlive";
    if (1 < iVar10) {
      pcVar5 = "";
    }
    pcVar8 = " IsActive";
    if (1 < iVar11) {
      pcVar8 = "";
    }
    pcVar9 = " WantLockSizeOnce";
    if (-1 < (short)*(uint *)&node->field_0xbc) {
      pcVar9 = "";
    }
    pcVar4 = " HasCentralNodeChild";
    if ((*(uint *)&node->field_0xbc >> 0xd & 1) == 0) {
      pcVar4 = "";
    }
    BulletText("Misc:%s%s%s%s%s%s",pcVar7,pcVar6,pcVar5,pcVar8,pcVar9,pcVar4);
    bVar1 = TreeNode("flags",
                     "Flags Merged: 0x%04X, Local: 0x%04X, InWindows: 0x%04X, Shared: 0x%04X",
                     (ulong)(uint)node->MergedFlags,(ulong)(uint)node->LocalFlags,
                     (ulong)(uint)node->LocalFlagsInWindows,(ulong)(uint)node->SharedFlags);
    if (bVar1) {
      local_38.x = 0.0;
      local_38.y = 0.0;
      bVar1 = BeginTable("flags",4,0,&local_38,0.0);
      if (bVar1) {
        TableNextColumn();
        DebugNodeDockNodeFlags(&node->MergedFlags,"MergedFlags",false);
        TableNextColumn();
        DebugNodeDockNodeFlags(&node->LocalFlags,"LocalFlags",true);
        TableNextColumn();
        DebugNodeDockNodeFlags(&node->LocalFlagsInWindows,"LocalFlagsInWindows",false);
        TableNextColumn();
        DebugNodeDockNodeFlags(&node->SharedFlags,"SharedFlags",true);
        EndTable();
      }
      TreePop();
    }
    if (node->ParentNode != (ImGuiDockNode *)0x0) {
      DebugNodeDockNode(node->ParentNode,"ParentNode");
    }
    if (node->ChildNodes[0] != (ImGuiDockNode *)0x0) {
      DebugNodeDockNode(node->ChildNodes[0],"Child[0]");
    }
    if (node->ChildNodes[1] != (ImGuiDockNode *)0x0) {
      DebugNodeDockNode(node->ChildNodes[1],"Child[1]");
    }
    if (node->TabBar != (ImGuiTabBar *)0x0) {
      DebugNodeTabBar(node->TabBar,"TabBar");
    }
    TreePop();
  }
  return;
}

Assistant:

void ImGui::DebugNodeDockNode(ImGuiDockNode* node, const char* label)
{
    ImGuiContext& g = *GImGui;
    const bool is_alive = (g.FrameCount - node->LastFrameAlive < 2);    // Submitted with ImGuiDockNodeFlags_KeepAliveOnly
    const bool is_active = (g.FrameCount - node->LastFrameActive < 2);  // Submitted
    if (!is_alive) { PushStyleColor(ImGuiCol_Text, GetStyleColorVec4(ImGuiCol_TextDisabled)); }
    bool open;
    if (node->Windows.Size > 0)
        open = TreeNode((void*)(intptr_t)node->ID, "%s 0x%04X%s: %d windows (vis: '%s')", label, node->ID, node->IsVisible ? "" : " (hidden)", node->Windows.Size, node->VisibleWindow ? node->VisibleWindow->Name : "NULL");
    else
        open = TreeNode((void*)(intptr_t)node->ID, "%s 0x%04X%s: %s split (vis: '%s')", label, node->ID, node->IsVisible ? "" : " (hidden)", (node->SplitAxis == ImGuiAxis_X) ? "horizontal" : (node->SplitAxis == ImGuiAxis_Y) ? "vertical" : "n/a", node->VisibleWindow ? node->VisibleWindow->Name : "NULL");
    if (!is_alive) { PopStyleColor(); }
    if (is_active && IsItemHovered())
        if (ImGuiWindow* window = node->HostWindow ? node->HostWindow : node->VisibleWindow)
            GetForegroundDrawList(window)->AddRect(node->Pos, node->Pos + node->Size, IM_COL32(255, 255, 0, 255));
    if (open)
    {
        IM_ASSERT(node->ChildNodes[0] == NULL || node->ChildNodes[0]->ParentNode == node);
        IM_ASSERT(node->ChildNodes[1] == NULL || node->ChildNodes[1]->ParentNode == node);
        BulletText("Pos (%.0f,%.0f), Size (%.0f, %.0f) Ref (%.0f, %.0f)",
            node->Pos.x, node->Pos.y, node->Size.x, node->Size.y, node->SizeRef.x, node->SizeRef.y);
        DebugNodeWindow(node->HostWindow, "HostWindow");
        DebugNodeWindow(node->VisibleWindow, "VisibleWindow");
        BulletText("SelectedTabID: 0x%08X, LastFocusedNodeID: 0x%08X", node->SelectedTabId, node->LastFocusedNodeId);
        BulletText("Misc:%s%s%s%s%s%s",
            node->IsDockSpace() ? " IsDockSpace" : "",
            node->IsCentralNode() ? " IsCentralNode" : "",
            is_alive ? " IsAlive" : "", is_active ? " IsActive" : "",
            node->WantLockSizeOnce ? " WantLockSizeOnce" : "",
            node->HasCentralNodeChild ? " HasCentralNodeChild" : "");
        if (TreeNode("flags", "Flags Merged: 0x%04X, Local: 0x%04X, InWindows: 0x%04X, Shared: 0x%04X", node->MergedFlags, node->LocalFlags, node->LocalFlagsInWindows, node->SharedFlags))
        {
            if (BeginTable("flags", 4))
            {
                TableNextColumn(); DebugNodeDockNodeFlags(&node->MergedFlags, "MergedFlags", false);
                TableNextColumn(); DebugNodeDockNodeFlags(&node->LocalFlags, "LocalFlags", true);
                TableNextColumn(); DebugNodeDockNodeFlags(&node->LocalFlagsInWindows, "LocalFlagsInWindows", false);
                TableNextColumn(); DebugNodeDockNodeFlags(&node->SharedFlags, "SharedFlags", true);
                EndTable();
            }
            TreePop();
        }
        if (node->ParentNode)
            DebugNodeDockNode(node->ParentNode, "ParentNode");
        if (node->ChildNodes[0])
            DebugNodeDockNode(node->ChildNodes[0], "Child[0]");
        if (node->ChildNodes[1])
            DebugNodeDockNode(node->ChildNodes[1], "Child[1]");
        if (node->TabBar)
            DebugNodeTabBar(node->TabBar, "TabBar");
        TreePop();
    }
}